

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.c
# Opt level: O3

int chain_segment_mix(mixed_segment *segment)

{
  long *plVar1;
  code *pcVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  
  plVar1 = (long *)segment->data;
  uVar6 = (ulong)*(uint *)(plVar1 + 1);
  if (uVar6 == 0) {
    uVar4 = 1;
  }
  else {
    bVar7 = false;
    uVar5 = 1;
    do {
      pcVar2 = *(code **)(*(long *)(*plVar1 + -8 + uVar5 * 8) + 0x18);
      if (pcVar2 != (code *)0x0) {
        iVar3 = (*pcVar2)();
        if (iVar3 == 0) break;
      }
      bVar7 = uVar6 <= uVar5;
      bVar8 = uVar5 != uVar6;
      uVar5 = uVar5 + 1;
    } while (bVar8);
    uVar4 = (uint)bVar7;
  }
  return uVar4;
}

Assistant:

int chain_segment_mix(struct mixed_segment *segment){
  struct vector *data = (struct vector *)segment->data;
  uint32_t count = data->count;
  for(uint32_t i=0; i<count; ++i){
    struct mixed_segment *segment = (struct mixed_segment *)data->data[i];
    if(segment->mix){
      if(!segment->mix(segment)){
        return 0;
      }
    }
  }
  return 1;
}